

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O1

atomic<unsigned_int> * __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t::operator[](data_t *this,size_t index)

{
  atomic<std::array<std::atomic<unsigned_int>,_128UL>_*> *paVar1;
  __pointer_type paVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = index >> 7;
  paVar2 = (this->arr)._M_elems[uVar3]._M_b._M_p;
  if (paVar2 == (__pointer_type)0x0) {
    paVar2 = (__pointer_type)operator_new(0x200);
    memset(paVar2,0,0x200);
    paVar1 = (this->arr)._M_elems + uVar3;
    LOCK();
    bVar4 = (paVar1->_M_b)._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (paVar1->_M_b)._M_p = paVar2;
    }
    UNLOCK();
    if (!bVar4) {
      operator_delete(paVar2,0x200);
    }
    paVar2 = (this->arr)._M_elems[uVar3]._M_b._M_p;
  }
  return paVar2->_M_elems + ((uint)index & 0x7f);
}

Assistant:

std::atomic<uint_type>& operator[](std::size_t index) {
      piece_t* piece = arr[index / piece_size];
      if (piece == nullptr) {
        auto ptr = new piece_t{};
        if (!arr[index / piece_size].compare_exchange_strong(piece, ptr)) {
          delete ptr;
        }
        return (*arr[index / piece_size].load())[index % piece_size];
      }
      else {
        return (*piece)[index % piece_size];
      }
    }